

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

void __thiscall leveldb::TableCache::~TableCache(TableCache *this)

{
  TableCache *this_local;
  
  if (this->cache_ != (Cache *)0x0) {
    (*this->cache_->_vptr_Cache[1])();
  }
  std::__cxx11::string::~string((string *)&this->dbname_);
  return;
}

Assistant:

TableCache::~TableCache() { delete cache_; }